

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O3

DataType glu::getDataTypeFromGLType(deUint32 glType)

{
  if ((int)glType < 0x8f46) {
    switch(glType) {
    case 0x8b50:
      return TYPE_FLOAT_VEC2;
    case 0x8b51:
      return TYPE_FLOAT_VEC3;
    case 0x8b52:
      return TYPE_FLOAT_VEC4;
    case 0x8b53:
      return TYPE_INT_VEC2;
    case 0x8b54:
      return TYPE_INT_VEC3;
    case 0x8b55:
      return TYPE_INT_VEC4;
    case 0x8b56:
      return TYPE_BOOL;
    case 0x8b57:
      return TYPE_BOOL_VEC2;
    case 0x8b58:
      return TYPE_BOOL_VEC3;
    case 0x8b59:
      return TYPE_BOOL_VEC4;
    case 0x8b5a:
      return TYPE_FLOAT_MAT2;
    case 0x8b5b:
      return TYPE_FLOAT_MAT3;
    case 0x8b5c:
      return TYPE_FLOAT_MAT4;
    case 0x8b5d:
      return TYPE_SAMPLER_1D;
    case 0x8b5e:
      return TYPE_SAMPLER_2D;
    case 0x8b5f:
      return TYPE_SAMPLER_3D;
    case 0x8b60:
      return TYPE_SAMPLER_CUBE;
    case 0x8b61:
      return TYPE_SAMPLER_1D_SHADOW;
    case 0x8b62:
      return TYPE_SAMPLER_2D_SHADOW;
    case 0x8b63:
    case 0x8b64:
      break;
    case 0x8b65:
      return TYPE_FLOAT_MAT2X3;
    case 0x8b66:
      return TYPE_FLOAT_MAT2X4;
    case 0x8b67:
      return TYPE_FLOAT_MAT3X2;
    case 0x8b68:
      return TYPE_FLOAT_MAT3X4;
    case 0x8b69:
      return TYPE_FLOAT_MAT4X2;
    case 0x8b6a:
      return TYPE_FLOAT_MAT4X3;
    default:
      switch(glType) {
      case 0x8dc0:
        return TYPE_SAMPLER_1D_ARRAY;
      case 0x8dc1:
        return TYPE_SAMPLER_2D_ARRAY;
      case 0x8dc2:
        return TYPE_SAMPLER_BUFFER;
      case 0x8dc3:
        return TYPE_SAMPLER_1D_ARRAY_SHADOW;
      case 0x8dc4:
        return TYPE_SAMPLER_2D_ARRAY_SHADOW;
      case 0x8dc5:
        return TYPE_SAMPLER_CUBE_SHADOW;
      case 0x8dc6:
        return TYPE_UINT_VEC2;
      case 0x8dc7:
        return TYPE_UINT_VEC3;
      case 0x8dc8:
        return TYPE_UINT_VEC4;
      case 0x8dc9:
        return TYPE_INT_SAMPLER_1D;
      case 0x8dca:
        return TYPE_INT_SAMPLER_2D;
      case 0x8dcb:
        return TYPE_INT_SAMPLER_3D;
      case 0x8dcc:
        return TYPE_INT_SAMPLER_CUBE;
      case 0x8dcd:
      case 0x8dd5:
        break;
      case 0x8dce:
        return TYPE_INT_SAMPLER_1D_ARRAY;
      case 0x8dcf:
        return TYPE_INT_SAMPLER_2D_ARRAY;
      case 0x8dd0:
        return TYPE_INT_SAMPLER_BUFFER;
      case 0x8dd1:
        return TYPE_UINT_SAMPLER_1D;
      case 0x8dd2:
        return TYPE_UINT_SAMPLER_2D;
      case 0x8dd3:
        return TYPE_UINT_SAMPLER_3D;
      case 0x8dd4:
        return TYPE_UINT_SAMPLER_CUBE;
      case 0x8dd6:
        return TYPE_UINT_SAMPLER_1D_ARRAY;
      case 0x8dd7:
        return TYPE_UINT_SAMPLER_2D_ARRAY;
      case 0x8dd8:
        return TYPE_UINT_SAMPLER_BUFFER;
      default:
        switch(glType) {
        case 0x1404:
          return TYPE_INT;
        case 0x1405:
          return TYPE_UINT;
        case 0x1406:
          return TYPE_FLOAT;
        case 0x140a:
          return TYPE_DOUBLE;
        }
      }
    }
  }
  else if ((int)glType < 0x904d) {
    if ((int)glType < 0x8ffd) {
      switch(glType) {
      case 0x8f46:
        return TYPE_DOUBLE_MAT2;
      case 0x8f47:
        return TYPE_DOUBLE_MAT3;
      case 0x8f48:
        return TYPE_DOUBLE_MAT4;
      case 0x8f49:
        return TYPE_DOUBLE_MAT2X3;
      case 0x8f4a:
        return TYPE_DOUBLE_MAT2X4;
      case 0x8f4b:
        return TYPE_DOUBLE_MAT3X2;
      case 0x8f4c:
        return TYPE_DOUBLE_MAT3X4;
      case 0x8f4d:
        return TYPE_DOUBLE_MAT4X2;
      case 0x8f4e:
        return TYPE_DOUBLE_MAT4X3;
      }
      if (glType == 0x8ffc) {
        return TYPE_DOUBLE_VEC2;
      }
    }
    else {
      switch(glType) {
      case 0x900c:
        return TYPE_SAMPLER_CUBE_ARRAY;
      case 0x900d:
        return TYPE_SAMPLER_CUBE_ARRAY_SHADOW;
      case 0x900e:
        return TYPE_INT_SAMPLER_CUBE_ARRAY;
      case 0x900f:
        return TYPE_UINT_SAMPLER_CUBE_ARRAY;
      }
      if (glType == 0x8ffd) {
        return TYPE_DOUBLE_VEC3;
      }
      if (glType == 0x8ffe) {
        return TYPE_DOUBLE_VEC4;
      }
    }
  }
  else {
    switch(glType) {
    case 0x904d:
      return TYPE_IMAGE_2D;
    case 0x904e:
      return TYPE_IMAGE_3D;
    case 0x904f:
    case 0x9052:
    case 0x9054:
    case 0x9055:
    case 0x9056:
    case 0x9057:
    case 0x905a:
    case 0x905d:
    case 0x905f:
    case 0x9060:
    case 0x9061:
    case 0x9062:
    case 0x9065:
    case 0x9068:
      break;
    case 0x9050:
      return TYPE_IMAGE_CUBE;
    case 0x9051:
      return TYPE_IMAGE_BUFFER;
    case 0x9053:
      return TYPE_IMAGE_2D_ARRAY;
    case 0x9058:
      return TYPE_INT_IMAGE_2D;
    case 0x9059:
      return TYPE_INT_IMAGE_3D;
    case 0x905b:
      return TYPE_INT_IMAGE_CUBE;
    case 0x905c:
      return TYPE_INT_IMAGE_BUFFER;
    case 0x905e:
      return TYPE_INT_IMAGE_2D_ARRAY;
    case 0x9063:
      return TYPE_UINT_IMAGE_2D;
    case 0x9064:
      return TYPE_UINT_IMAGE_3D;
    case 0x9066:
      return TYPE_UINT_IMAGE_CUBE;
    case 0x9067:
      return TYPE_UINT_IMAGE_BUFFER;
    case 0x9069:
      return TYPE_UINT_IMAGE_2D_ARRAY;
    default:
      switch(glType) {
      case 0x9108:
        return TYPE_SAMPLER_2D_MULTISAMPLE;
      case 0x9109:
        return TYPE_INT_SAMPLER_2D_MULTISAMPLE;
      case 0x910a:
        return TYPE_UINT_SAMPLER_2D_MULTISAMPLE;
      case 0x910b:
        return TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY;
      case 0x910c:
        return TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY;
      case 0x910d:
        return TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY;
      }
      if (glType == 0x92db) {
        return TYPE_UINT_ATOMIC_COUNTER;
      }
    }
  }
  return TYPE_LAST;
}

Assistant:

DataType getDataTypeFromGLType (deUint32 glType)
{
	switch (glType)
	{
		case GL_FLOAT:										return TYPE_FLOAT;
		case GL_FLOAT_VEC2:									return TYPE_FLOAT_VEC2;
		case GL_FLOAT_VEC3:									return TYPE_FLOAT_VEC3;
		case GL_FLOAT_VEC4:									return TYPE_FLOAT_VEC4;

		case GL_FLOAT_MAT2:									return TYPE_FLOAT_MAT2;
		case GL_FLOAT_MAT2x3:								return TYPE_FLOAT_MAT2X3;
		case GL_FLOAT_MAT2x4:								return TYPE_FLOAT_MAT2X4;

		case GL_FLOAT_MAT3x2:								return TYPE_FLOAT_MAT3X2;
		case GL_FLOAT_MAT3:									return TYPE_FLOAT_MAT3;
		case GL_FLOAT_MAT3x4:								return TYPE_FLOAT_MAT3X4;

		case GL_FLOAT_MAT4x2:								return TYPE_FLOAT_MAT4X2;
		case GL_FLOAT_MAT4x3:								return TYPE_FLOAT_MAT4X3;
		case GL_FLOAT_MAT4:									return TYPE_FLOAT_MAT4;

		case GL_DOUBLE:										return TYPE_DOUBLE;
		case GL_DOUBLE_VEC2:								return TYPE_DOUBLE_VEC2;
		case GL_DOUBLE_VEC3:								return TYPE_DOUBLE_VEC3;
		case GL_DOUBLE_VEC4:								return TYPE_DOUBLE_VEC4;

		case GL_DOUBLE_MAT2:								return TYPE_DOUBLE_MAT2;
		case GL_DOUBLE_MAT2x3:								return TYPE_DOUBLE_MAT2X3;
		case GL_DOUBLE_MAT2x4:								return TYPE_DOUBLE_MAT2X4;

		case GL_DOUBLE_MAT3x2:								return TYPE_DOUBLE_MAT3X2;
		case GL_DOUBLE_MAT3:								return TYPE_DOUBLE_MAT3;
		case GL_DOUBLE_MAT3x4:								return TYPE_DOUBLE_MAT3X4;

		case GL_DOUBLE_MAT4x2:								return TYPE_DOUBLE_MAT4X2;
		case GL_DOUBLE_MAT4x3:								return TYPE_DOUBLE_MAT4X3;
		case GL_DOUBLE_MAT4:								return TYPE_DOUBLE_MAT4;

		case GL_INT:										return TYPE_INT;
		case GL_INT_VEC2:									return TYPE_INT_VEC2;
		case GL_INT_VEC3:									return TYPE_INT_VEC3;
		case GL_INT_VEC4:									return TYPE_INT_VEC4;

		case GL_UNSIGNED_INT:								return TYPE_UINT;
		case GL_UNSIGNED_INT_VEC2:							return TYPE_UINT_VEC2;
		case GL_UNSIGNED_INT_VEC3:							return TYPE_UINT_VEC3;
		case GL_UNSIGNED_INT_VEC4:							return TYPE_UINT_VEC4;

		case GL_BOOL:										return TYPE_BOOL;
		case GL_BOOL_VEC2:									return TYPE_BOOL_VEC2;
		case GL_BOOL_VEC3:									return TYPE_BOOL_VEC3;
		case GL_BOOL_VEC4:									return TYPE_BOOL_VEC4;

		case GL_SAMPLER_1D:									return TYPE_SAMPLER_1D;
		case GL_SAMPLER_2D:									return TYPE_SAMPLER_2D;
		case GL_SAMPLER_CUBE:								return TYPE_SAMPLER_CUBE;
		case GL_SAMPLER_1D_ARRAY:							return TYPE_SAMPLER_1D_ARRAY;
		case GL_SAMPLER_2D_ARRAY:							return TYPE_SAMPLER_2D_ARRAY;
		case GL_SAMPLER_3D:									return TYPE_SAMPLER_3D;
		case GL_SAMPLER_CUBE_MAP_ARRAY:						return TYPE_SAMPLER_CUBE_ARRAY;

		case GL_SAMPLER_1D_SHADOW:							return TYPE_SAMPLER_1D_SHADOW;
		case GL_SAMPLER_2D_SHADOW:							return TYPE_SAMPLER_2D_SHADOW;
		case GL_SAMPLER_CUBE_SHADOW:						return TYPE_SAMPLER_CUBE_SHADOW;
		case GL_SAMPLER_1D_ARRAY_SHADOW:					return TYPE_SAMPLER_1D_ARRAY_SHADOW;
		case GL_SAMPLER_2D_ARRAY_SHADOW:					return TYPE_SAMPLER_2D_ARRAY_SHADOW;
		case GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW:				return TYPE_SAMPLER_CUBE_ARRAY_SHADOW;

		case GL_INT_SAMPLER_1D:								return TYPE_INT_SAMPLER_1D;
		case GL_INT_SAMPLER_2D:								return TYPE_INT_SAMPLER_2D;
		case GL_INT_SAMPLER_CUBE:							return TYPE_INT_SAMPLER_CUBE;
		case GL_INT_SAMPLER_1D_ARRAY:						return TYPE_INT_SAMPLER_1D_ARRAY;
		case GL_INT_SAMPLER_2D_ARRAY:						return TYPE_INT_SAMPLER_2D_ARRAY;
		case GL_INT_SAMPLER_3D:								return TYPE_INT_SAMPLER_3D;
		case GL_INT_SAMPLER_CUBE_MAP_ARRAY:					return TYPE_INT_SAMPLER_CUBE_ARRAY;

		case GL_UNSIGNED_INT_SAMPLER_1D:					return TYPE_UINT_SAMPLER_1D;
		case GL_UNSIGNED_INT_SAMPLER_2D:					return TYPE_UINT_SAMPLER_2D;
		case GL_UNSIGNED_INT_SAMPLER_CUBE:					return TYPE_UINT_SAMPLER_CUBE;
		case GL_UNSIGNED_INT_SAMPLER_1D_ARRAY:				return TYPE_UINT_SAMPLER_1D_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_2D_ARRAY:				return TYPE_UINT_SAMPLER_2D_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_3D:					return TYPE_UINT_SAMPLER_3D;
		case GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY:		return TYPE_UINT_SAMPLER_CUBE_ARRAY;

		case GL_SAMPLER_2D_MULTISAMPLE:						return TYPE_SAMPLER_2D_MULTISAMPLE;
		case GL_INT_SAMPLER_2D_MULTISAMPLE:					return TYPE_INT_SAMPLER_2D_MULTISAMPLE;
		case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE:		return TYPE_UINT_SAMPLER_2D_MULTISAMPLE;

		case GL_IMAGE_2D:									return TYPE_IMAGE_2D;
		case GL_IMAGE_CUBE:									return TYPE_IMAGE_CUBE;
		case GL_IMAGE_2D_ARRAY:								return TYPE_IMAGE_2D_ARRAY;
		case GL_IMAGE_3D:									return TYPE_IMAGE_3D;
		case GL_INT_IMAGE_2D:								return TYPE_INT_IMAGE_2D;
		case GL_INT_IMAGE_CUBE:								return TYPE_INT_IMAGE_CUBE;
		case GL_INT_IMAGE_2D_ARRAY:							return TYPE_INT_IMAGE_2D_ARRAY;
		case GL_INT_IMAGE_3D:								return TYPE_INT_IMAGE_3D;
		case GL_UNSIGNED_INT_IMAGE_2D:						return TYPE_UINT_IMAGE_2D;
		case GL_UNSIGNED_INT_IMAGE_CUBE:					return TYPE_UINT_IMAGE_CUBE;
		case GL_UNSIGNED_INT_IMAGE_2D_ARRAY:				return TYPE_UINT_IMAGE_2D_ARRAY;
		case GL_UNSIGNED_INT_IMAGE_3D:						return TYPE_UINT_IMAGE_3D;

		case GL_UNSIGNED_INT_ATOMIC_COUNTER:				return TYPE_UINT_ATOMIC_COUNTER;

		case GL_SAMPLER_BUFFER:								return TYPE_SAMPLER_BUFFER;
		case GL_INT_SAMPLER_BUFFER:							return TYPE_INT_SAMPLER_BUFFER;
		case GL_UNSIGNED_INT_SAMPLER_BUFFER:				return TYPE_UINT_SAMPLER_BUFFER;

		case GL_SAMPLER_2D_MULTISAMPLE_ARRAY:				return TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY;
		case GL_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:			return TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY;
		case GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:	return TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY;

		case GL_IMAGE_BUFFER:								return TYPE_IMAGE_BUFFER;
		case GL_INT_IMAGE_BUFFER:							return TYPE_INT_IMAGE_BUFFER;
		case GL_UNSIGNED_INT_IMAGE_BUFFER:					return TYPE_UINT_IMAGE_BUFFER;

		default:
			return TYPE_LAST;
	}
}